

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O1

void init_driver(audit_regressor_data *dat)

{
  pointer pcVar1;
  float fVar2;
  options_i *poVar3;
  vw *pvVar4;
  uint *puVar5;
  _func_int *p_Var6;
  bool bVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  typed_option<unsigned_int> *ptVar11;
  _Hash_node_base *p_Var12;
  float *pfVar13;
  ostream *poVar14;
  vw_exception *pvVar15;
  size_t sVar16;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  vw_ostream *pvVar20;
  stringstream __msg;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  poVar3 = dat->all->options;
  pcVar1 = local_1b8 + 0x10;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"cache_file","");
  iVar9 = (*poVar3->_vptr_options_i[1])(poVar3,local_1b8);
  if ((byte)iVar9 == 0) {
    poVar3 = dat->all->options;
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"cache","");
    iVar10 = (*poVar3->_vptr_options_i[1])(poVar3,local_218);
    if ((char)iVar10 == '\0') {
      bVar17 = 1;
      bVar7 = false;
      bVar18 = 0;
      goto LAB_001f392b;
    }
  }
  bVar17 = (byte)iVar9 ^ 1;
  poVar3 = dat->all->options;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"kill_cache","");
  iVar9 = (*poVar3->_vptr_options_i[1])(poVar3,local_238);
  bVar18 = (byte)iVar9 ^ 1;
  bVar7 = true;
LAB_001f392b:
  if ((bVar7) && (local_238[0] != local_228)) {
    operator_delete(local_238[0]);
  }
  if ((bVar17 != 0) && (local_218[0] != local_208)) {
    operator_delete(local_218[0]);
  }
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if (bVar18 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),
               "audit_regressor is incompatible with a cache file.  Use it in single pass mode only."
               ,0x54);
    pvVar15 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar15,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
               ,0xcf,&local_1d8);
    __cxa_throw(pvVar15,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dat->all->sd->dump_interval = 1.0;
  dat->all->sd->example_number = 0;
  pvVar4 = dat->all;
  dat->increment = *(ulong *)(pvVar4->l + 0xe0) / *(ulong *)(pvVar4->l + 0xd8);
  dat->total_class_cnt = *(size_t *)(pvVar4->l + 0xd8);
  poVar3 = pvVar4->options;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"csoaa","");
  iVar9 = (*poVar3->_vptr_options_i[1])(poVar3,local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((char)iVar9 != '\0') {
    poVar3 = dat->all->options;
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"csoaa","");
    ptVar11 = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,(string *)local_1b8);
    puVar5 = (ptVar11->m_value).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (puVar5 == (uint *)0x0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*puVar5;
    }
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if (dat->total_class_cnt != uVar19) {
      dat->total_class_cnt = uVar19;
      dat->increment = *(ulong *)(dat->all->l + 0xe0) / uVar19;
    }
  }
  pvVar4 = dat->all;
  if ((pvVar4->weights).sparse == true) {
    p_Var12 = (pvVar4->weights).sparse_weights._map._M_h._M_before_begin._M_nxt;
    if (p_Var12 != (_Hash_node_base *)0x0) {
      sVar16 = dat->loaded_regressor_values;
      do {
        fVar2 = *(float *)&(p_Var12[2]._M_nxt)->_M_nxt;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          sVar16 = sVar16 + 1;
          dat->loaded_regressor_values = sVar16;
        }
        p_Var12 = p_Var12->_M_nxt;
      } while (p_Var12 != (_Hash_node_base *)0x0);
    }
  }
  else {
    pfVar13 = (pvVar4->weights).dense_weights._begin;
    if (pfVar13 != pfVar13 + (pvVar4->weights).dense_weights._weight_mask + 1) {
      uVar8 = (pvVar4->weights).dense_weights._stride_shift;
      do {
        if ((*pfVar13 != 0.0) || (NAN(*pfVar13))) {
          dat->loaded_regressor_values = dat->loaded_regressor_values + 1;
        }
        pfVar13 = pfVar13 + (1L << ((byte)uVar8 & 0x3f));
      } while (pfVar13 !=
               (pvVar4->weights).dense_weights._begin +
               (pvVar4->weights).dense_weights._weight_mask + 1);
    }
  }
  if (dat->loaded_regressor_values == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"regressor has no non-zero weights. Nothing to audit.",
               0x34);
    pvVar15 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar15,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
               ,0xe9,&local_1f8);
    __cxa_throw(pvVar15,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (pvVar4->quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(pvVar4->trace_message).super_ostream,"Regressor contains ",0x13);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&pvVar4->trace_message);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," values\n",8);
    pvVar4 = dat->all;
    pvVar20 = &pvVar4->trace_message;
    p_Var6 = (pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(&(pvVar4->trace_message).super_ostream.field_0x18 + (long)p_Var6) =
         *(uint *)(&(pvVar4->trace_message).super_ostream.field_0x18 + (long)p_Var6) & 0xffffff4f |
         0x20;
    *(undefined8 *)
     (&(pvVar4->trace_message).super_ostream.field_0x10 +
     (long)(pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3]) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream,"example",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream," ",1);
    *(undefined8 *)
     (&(pvVar4->trace_message).super_ostream.field_0x10 +
     (long)(pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3]) = 0xe;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream,"values",6);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream," ",1);
    *(undefined8 *)
     (&(pvVar4->trace_message).super_ostream.field_0x10 +
     (long)(pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3]) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream,"total",5);
    std::ios::widen((char)(pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3] +
                    (char)pvVar20);
    std::ostream::put((char)pvVar20);
    std::ostream::flush();
    pvVar4 = dat->all;
    pvVar20 = &pvVar4->trace_message;
    p_Var6 = (pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(&(pvVar4->trace_message).super_ostream.field_0x18 + (long)p_Var6) =
         *(uint *)(&(pvVar4->trace_message).super_ostream.field_0x18 + (long)p_Var6) & 0xffffff4f |
         0x20;
    *(undefined8 *)
     (&(pvVar4->trace_message).super_ostream.field_0x10 +
     (long)(pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3]) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream,"counter",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream," ",1);
    *(undefined8 *)
     (&(pvVar4->trace_message).super_ostream.field_0x10 +
     (long)(pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3]) = 0xe;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream,"audited",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream," ",1);
    *(undefined8 *)
     (&(pvVar4->trace_message).super_ostream.field_0x10 +
     (long)(pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3]) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream,"progress",8);
    std::ios::widen((char)(pvVar4->trace_message).super_ostream._vptr_basic_ostream[-3] +
                    (char)pvVar20);
    std::ostream::put((char)pvVar20);
    std::ostream::flush();
  }
  return;
}

Assistant:

void init_driver(audit_regressor_data& dat)
{
  // checks a few settings that might be applied after audit_regressor_setup() is called
  if ((dat.all->options->was_supplied("cache_file") || dat.all->options->was_supplied("cache")) &&
      !dat.all->options->was_supplied("kill_cache"))
  {
    THROW("audit_regressor is incompatible with a cache file.  Use it in single pass mode only.");
  }

  dat.all->sd->dump_interval = 1.;  // regressor could initialize these if saved with --save_resume
  dat.all->sd->example_number = 0;

  dat.increment = dat.all->l->increment / dat.all->l->weights;
  dat.total_class_cnt = dat.all->l->weights;

  if (dat.all->options->was_supplied("csoaa"))
  {
    size_t n = dat.all->options->get_typed_option<uint32_t>("csoaa").value();
    if (n != dat.total_class_cnt)
    {
      dat.total_class_cnt = n;
      dat.increment = dat.all->l->increment / n;
    }
  }

  // count non-null feature values in regressor
  if (dat.all->weights.sparse)
    regressor_values(dat, dat.all->weights.sparse_weights);
  else
    regressor_values(dat, dat.all->weights.dense_weights);

  if (dat.loaded_regressor_values == 0)
    THROW("regressor has no non-zero weights. Nothing to audit.");

  if (!dat.all->quiet)
  {
    dat.all->trace_message << "Regressor contains " << dat.loaded_regressor_values << " values\n";
    dat.all->trace_message << std::left << std::setw(shared_data::col_example_counter) << "example"
                           << " " << std::setw(shared_data::col_example_weight) << "values"
                           << " " << std::setw(shared_data::col_current_label) << "total" << std::endl;
    dat.all->trace_message << std::left << std::setw(shared_data::col_example_counter) << "counter"
                           << " " << std::setw(shared_data::col_example_weight) << "audited"
                           << " " << std::setw(shared_data::col_current_label) << "progress" << std::endl;
  }
}